

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::setOSName(Triple *this,StringRef Str)

{
  bool bVar1;
  Twine local_220;
  Twine local_208;
  StringRef local_1f0;
  Twine local_1e0;
  StringRef local_1c8;
  Twine local_1b8;
  Twine local_1a0;
  Twine local_188;
  Twine local_170;
  StringRef local_158;
  Twine local_148;
  Twine local_130;
  Twine local_118;
  Twine local_100;
  StringRef local_e8;
  Twine local_d8;
  StringRef local_c0;
  Twine local_b0;
  Twine local_98;
  Twine local_80;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  Triple *local_20;
  Triple *this_local;
  StringRef Str_local;
  
  Str_local.Data = (char *)Str.Length;
  this_local = (Triple *)Str.Data;
  local_20 = this;
  bVar1 = hasEnvironment(this);
  if (bVar1) {
    local_c0 = getArchName(this);
    llvm::operator+(&local_b0,&local_c0,"-");
    local_e8 = getVendorName(this);
    Twine::Twine(&local_d8,&local_e8);
    llvm::operator+(&local_98,&local_b0,&local_d8);
    Twine::Twine(&local_100,"-");
    llvm::operator+(&local_80,&local_98,&local_100);
    Twine::Twine(&local_118,(StringRef *)&this_local);
    llvm::operator+(&local_68,&local_80,&local_118);
    Twine::Twine(&local_130,"-");
    llvm::operator+(&local_50,&local_68,&local_130);
    local_158 = getEnvironmentName(this);
    Twine::Twine(&local_148,&local_158);
    llvm::operator+(&local_38,&local_50,&local_148);
    setTriple(this,&local_38);
  }
  else {
    local_1c8 = getArchName(this);
    llvm::operator+(&local_1b8,&local_1c8,"-");
    local_1f0 = getVendorName(this);
    Twine::Twine(&local_1e0,&local_1f0);
    llvm::operator+(&local_1a0,&local_1b8,&local_1e0);
    Twine::Twine(&local_208,"-");
    llvm::operator+(&local_188,&local_1a0,&local_208);
    Twine::Twine(&local_220,(StringRef *)&this_local);
    llvm::operator+(&local_170,&local_188,&local_220);
    setTriple(this,&local_170);
  }
  return;
}

Assistant:

void Triple::setOSName(StringRef Str) {
  if (hasEnvironment())
    setTriple(getArchName() + "-" + getVendorName() + "-" + Str +
              "-" + getEnvironmentName());
  else
    setTriple(getArchName() + "-" + getVendorName() + "-" + Str);
}